

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::PLP_IP(CPU *this)

{
  int iVar1;
  
  this->cycles = 3;
  iVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(this->sp + 0x101));
  this->sp = this->sp + '\x01';
  (this->field_6).ps = (uint8_t)iVar1;
  this->cycles = this->cycles - 2;
  return;
}

Assistant:

void CPU::PLP_IP()
{
    cycles = 4;
    ps = GetStackByte();
    cycles--;
}